

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_resumption(void)

{
  ptls_iovec_t pVar1;
  ptls_iovec_t ticket;
  ptls_iovec_t ticket_00;
  ptls_iovec_t ticket_01;
  uint8_t *local_28;
  size_t local_20;
  ptls_save_ticket_t local_18;
  ptls_save_ticket_t st;
  ptls_encrypt_ticket_t et;
  
  st.cb = copy_ticket;
  local_18.cb = save_ticket;
  if (ctx_peer->ticket_lifetime != 0) {
    __assert_fail("ctx_peer->ticket_lifetime == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                  ,0x11a,"void test_resumption(void)");
  }
  if (ctx_peer->max_early_data_size != 0) {
    __assert_fail("ctx_peer->max_early_data_size == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                  ,0x11b,"void test_resumption(void)");
  }
  if (ctx_peer->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0) {
    __assert_fail("ctx_peer->encrypt_ticket == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                  ,0x11c,"void test_resumption(void)");
  }
  if (ctx_peer->decrypt_ticket == (ptls_encrypt_ticket_t *)0x0) {
    if (ctx_peer->save_ticket == (ptls_save_ticket_t *)0x0) {
      pVar1 = ptls_iovec_init((void *)0x0,0);
      local_28 = pVar1.base;
      saved_ticket.base = local_28;
      local_20 = pVar1.len;
      saved_ticket.len = local_20;
      ctx_peer->ticket_lifetime = 0x15180;
      ctx_peer->max_early_data_size = 0x2000;
      ctx_peer->encrypt_ticket = (ptls_encrypt_ticket_t *)&st;
      ctx_peer->decrypt_ticket = (ptls_encrypt_ticket_t *)&st;
      ctx->save_ticket = &local_18;
      lc_callcnt = 0;
      pVar1.len = saved_ticket.len;
      pVar1.base = saved_ticket.base;
      test_handshake(pVar1,0);
      _ok((uint)(lc_callcnt == 1),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
          ,0x129);
      _ok((uint)(saved_ticket.base != (uint8_t *)0x0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
          ,0x12a);
      ticket.len = saved_ticket.len;
      ticket.base = saved_ticket.base;
      test_handshake(ticket,0);
      _ok((uint)(lc_callcnt == 1),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
          ,0x12e);
      ctx->require_dhe_on_psk = 1;
      ticket_00.len = saved_ticket.len;
      ticket_00.base = saved_ticket.base;
      test_handshake(ticket_00,0);
      _ok((uint)(lc_callcnt == 1),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
          ,0x133);
      ctx->require_dhe_on_psk = 0;
      ticket_01.len = saved_ticket.len;
      ticket_01.base = saved_ticket.base;
      test_handshake(ticket_01,1);
      ctx_peer->ticket_lifetime = 0;
      ctx_peer->max_early_data_size = 0;
      ctx_peer->encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
      ctx_peer->decrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
      ctx->save_ticket = (ptls_save_ticket_t *)0x0;
      return;
    }
    __assert_fail("ctx_peer->save_ticket == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                  ,0x11e,"void test_resumption(void)");
  }
  __assert_fail("ctx_peer->decrypt_ticket == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                ,0x11d,"void test_resumption(void)");
}

Assistant:

static void test_resumption(void)
{
    ptls_encrypt_ticket_t et = {copy_ticket};
    ptls_save_ticket_t st = {save_ticket};

    assert(ctx_peer->ticket_lifetime == 0);
    assert(ctx_peer->max_early_data_size == 0);
    assert(ctx_peer->encrypt_ticket == NULL);
    assert(ctx_peer->decrypt_ticket == NULL);
    assert(ctx_peer->save_ticket == NULL);
    saved_ticket = ptls_iovec_init(NULL, 0);

    ctx_peer->ticket_lifetime = 86400;
    ctx_peer->max_early_data_size = 8192;
    ctx_peer->encrypt_ticket = &et;
    ctx_peer->decrypt_ticket = &et;
    ctx->save_ticket = &st;

    lc_callcnt = 0;
    test_handshake(saved_ticket, 0);
    ok(lc_callcnt == 1);
    ok(saved_ticket.base != NULL);

    /* psk using saved ticket */
    test_handshake(saved_ticket, 0);
    ok(lc_callcnt == 1);

    /* psk-dhe using saved ticket */
    ctx->require_dhe_on_psk = 1;
    test_handshake(saved_ticket, 0);
    ok(lc_callcnt == 1);
    ctx->require_dhe_on_psk = 0;

    /* 0-rtt psk using saved ticket */
    test_handshake(saved_ticket, 1);

    ctx_peer->ticket_lifetime = 0;
    ctx_peer->max_early_data_size = 0;
    ctx_peer->encrypt_ticket = NULL;
    ctx_peer->decrypt_ticket = NULL;
    ctx->save_ticket = NULL;
}